

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnLocalSetExpr(BinaryReaderIR *this,Index param_1)

{
  char *__s;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aVar1;
  Result RVar2;
  Expr *pEVar3;
  pointer *__ptr;
  Location loc;
  _Head_base<0UL,_wabt::Expr_*,_false> local_98;
  Location local_90;
  Var local_70;
  
  __s = this->filename_;
  aVar1.offset = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  local_90.field_1.field_0.last_column = 0;
  local_90.filename.size_ = strlen(__s);
  local_90.filename.data_ = __s;
  local_90.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)aVar1.offset;
  Var::Var(&local_70,param_1,&local_90);
  pEVar3 = (Expr *)operator_new(0x88);
  (pEVar3->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
  (pEVar3->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
  (pEVar3->loc).filename.data_ = (char *)0x0;
  (pEVar3->loc).filename.size_ = 0;
  *(undefined8 *)((long)&(pEVar3->loc).filename.size_ + 4) = 0;
  *(undefined8 *)((long)&(pEVar3->loc).field_1.field_1.offset + 4) = 0;
  pEVar3->type_ = LocalSet;
  pEVar3->_vptr_Expr = (_func_int **)&PTR__VarExpr_0019d390;
  Var::Var((Var *)(pEVar3 + 1),&local_70);
  local_98._M_head_impl = pEVar3;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_98);
  if (local_98._M_head_impl != (Expr *)0x0) {
    (*(local_98._M_head_impl)->_vptr_Expr[1])();
  }
  Var::~Var(&local_70);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnLocalSetExpr(Index local_index) {
  return AppendExpr(MakeUnique<LocalSetExpr>(Var(local_index, GetLocation())));
}